

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_endec_filter.hxx
# Opt level: O0

bool __thiscall
cryptox::
rotating_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>,_rotation_key_provider>
::filter(rotating_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>,_rotation_key_provider>
         *this,char **src_begin,char *src_end,char **dest_begin,char *dest_end,bool must_flush)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
  *this_00;
  byte local_8a;
  bool done_1;
  bool done;
  size_t available_input;
  size_t left;
  int loop;
  size_t b1;
  size_t b0;
  size_t output_size_1;
  size_t input_size_1;
  size_t output_size;
  size_t input_size;
  bool must_flush_local;
  char *dest_end_local;
  char **dest_begin_local;
  char *src_end_local;
  char **src_begin_local;
  rotating_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>,_rotation_key_provider>
  *this_local;
  
  output_size = std::distance<char_const*>(*src_begin,src_end);
  std::distance<char*>(*dest_begin,dest_end);
  if (this->_period != 0) {
    local_8a = 0;
    while( true ) {
      bVar2 = false;
      if (local_8a == 0) {
        sVar3 = symmetric_algorithm<&EVP_aes_256_cbc>::block_size();
        bVar2 = sVar3 < output_size;
      }
      if (!bVar2) break;
      pcVar1 = *src_begin;
      sVar3 = symmetric_algorithm<&EVP_aes_256_cbc>::block_size();
      bVar2 = basic_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>
              ::filter(&this->
                        super_basic_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>
                       ,src_begin,pcVar1 + sVar3,dest_begin,dest_end,false);
      local_8a = (bVar2 ^ 0xffU) & 1;
      output_size = std::distance<char_const*>(*src_begin,src_end);
      this_00 = (evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
                 *)std::
                   auto_ptr<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>::
                   operator->((auto_ptr<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>
                               *)this);
      sVar3 = evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
              ::total_output(this_00);
      if (sVar3 == this->_period) {
        rotate(this);
      }
    }
    if (must_flush) {
      rotate(this);
    }
  }
  std::distance<char_const*>(*src_begin,src_end);
  std::distance<char*>(*dest_begin,dest_end);
  bVar2 = basic_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>::
          filter(&this->
                  super_basic_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>
                 ,src_begin,src_end,dest_begin,dest_end,must_flush);
  return bVar2;
}

Assistant:

bool filter(const char*& src_begin, const char* src_end, char*& dest_begin, char* dest_end, bool must_flush) {
			size_t  input_size = std::distance( src_begin,  src_end);
			size_t output_size = std::distance(dest_begin, dest_end);

			// TODO: Separate this class into encryptor and decryptor filters.
			//       For now, just if-it.
			if (_period != 0 && detail::is_encryptor<Endec>::value) {
				size_t  input_size = std::distance( src_begin,  src_end);
				size_t output_size = std::distance(dest_begin, dest_end);

				const size_t b0 =  this->total_input()               / _period;
				const size_t b1 = (this->total_input() + input_size) / _period;

				// Block change?
				if (b0 != b1) {
					int loop = 0;

					size_t left = _period - (this->total_input() % _period);
					size_t available_input = std::min BOOST_PREVENT_MACRO_SUBSTITUTION(input_size, left);

					bool done = false;
					while (!done && left > 0 && available_input > 0) {
						done = !base_type::filter(src_begin, src_begin + available_input, dest_begin, dest_end, false);
						left -= available_input;

						 input_size = std::distance( src_begin,  src_end);
						output_size = std::distance(dest_begin, dest_end);
						available_input = std::min BOOST_PREVENT_MACRO_SUBSTITUTION(input_size, left);
					}

					rotate();

					return true;
				}
			}

			// TODO: Separate this class into encryptor and decryptor filters.
			//       For now, just if-it.
			if (_period != 0 && detail::is_decryptor<Endec>::value) {
				bool done = false;
				while (!done && input_size > Endec::algorithm_type::block_size()) {
					// FIXME: Only consuming one block at a time.

					done = !base_type::filter(src_begin, src_begin + Endec::algorithm_type::block_size(), dest_begin, dest_end, false);
					input_size = std::distance(src_begin, src_end);

					if (this->_endec->total_output() == _period)
						rotate();
				}

				if (must_flush)
					rotate();
			}

			 input_size = std::distance( src_begin,  src_end);
			output_size = std::distance(dest_begin, dest_end);

			return base_type::filter(src_begin, src_end, dest_begin, dest_end, must_flush);
		}